

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::IgnorablesMatcher::IgnorablesMatcher(IgnorablesMatcher *this,Key key)

{
  UnicodeString local_58;
  Key local_14;
  IgnorablesMatcher *pIStack_10;
  Key key_local;
  IgnorablesMatcher *this_local;
  
  local_14 = key;
  pIStack_10 = this;
  UnicodeString::UnicodeString(&local_58);
  SymbolMatcher::SymbolMatcher(&this->super_SymbolMatcher,&local_58,local_14);
  UnicodeString::~UnicodeString(&local_58);
  (this->super_SymbolMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__IgnorablesMatcher_004fedf8;
  return;
}

Assistant:

IgnorablesMatcher::IgnorablesMatcher(unisets::Key key)
        : SymbolMatcher({}, key) {
}